

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoSimdRelaxedMadd<float>(Thread *this)

{
  u8 i;
  long lVar1;
  SS result;
  Simd<float,_(unsigned_char)__x04_> a;
  Simd<float,_(unsigned_char)__x04_> b;
  Simd<float,_(unsigned_char)__x04_> c;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  anon_union_16_6_113bff37_for_Value_0 local_18;
  
  local_18.v128_.v = (v128)Pop(this);
  local_28.v128_.v = (v128)Pop(this);
  local_38.v128_.v = (v128)Pop(this);
  lVar1 = 0;
  do {
    *(float *)((long)&local_48 + lVar1 * 4) =
         *(float *)((long)&local_38 + lVar1 * 4) * *(float *)((long)&local_28 + lVar1 * 4) +
         *(float *)((long)&local_18 + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdRelaxedMadd() {
  using SS = typename Simd128<S>::Type;
  auto c = Pop<SS>();
  auto b = Pop<SS>();
  auto a = Pop<SS>();
  SS result;
  for (u8 i = 0; i < SS::lanes; ++i) {
    result[i] = a[i] * b[i] + c[i];
  }
  Push(result);
  return RunResult::Ok;
}